

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigDup.c
# Opt level: O0

Aig_Man_t * Saig_ManDupOrpos(Aig_Man_t *pAig)

{
  Vec_Ptr_t *p;
  int iVar1;
  char *pcVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  void *pvVar5;
  Aig_Obj_t *p1;
  int local_34;
  Aig_Obj_t *pAStack_30;
  int i;
  Aig_Obj_t *pMiter;
  Aig_Obj_t *pObj;
  Aig_Man_t *pAigNew;
  Aig_Man_t *pAig_local;
  
  if (pAig->nConstrs < 1) {
    iVar1 = Aig_ManNodeNum(pAig);
    pAig_local = Aig_ManStart(iVar1);
    pcVar2 = Abc_UtilStrsav(pAig->pName);
    pAig_local->pName = pcVar2;
    pAig_local->nConstrs = pAig->nConstrs;
    pAVar3 = Aig_ManConst1(pAig_local);
    pAVar4 = Aig_ManConst1(pAig);
    (pAVar4->field_5).pData = pAVar3;
    for (local_34 = 0; iVar1 = Vec_PtrSize(pAig->vCis), local_34 < iVar1; local_34 = local_34 + 1) {
      pvVar5 = Vec_PtrEntry(pAig->vCis,local_34);
      pAVar3 = Aig_ObjCreateCi(pAig_local);
      *(Aig_Obj_t **)((long)pvVar5 + 0x28) = pAVar3;
    }
    for (local_34 = 0; iVar1 = Vec_PtrSize(pAig->vObjs), local_34 < iVar1; local_34 = local_34 + 1)
    {
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,local_34);
      if ((pAVar3 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar3), iVar1 != 0)) {
        pAVar4 = Aig_ObjChild0Copy(pAVar3);
        p1 = Aig_ObjChild1Copy(pAVar3);
        pAVar4 = Aig_And(pAig_local,pAVar4,p1);
        (pAVar3->field_5).pData = pAVar4;
      }
    }
    pAStack_30 = Aig_ManConst0(pAig_local);
    for (local_34 = 0; iVar1 = Saig_ManPoNum(pAig), local_34 < iVar1; local_34 = local_34 + 1) {
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,local_34);
      pAVar3 = Aig_ObjChild0Copy(pAVar3);
      pAStack_30 = Aig_Or(pAig_local,pAStack_30,pAVar3);
    }
    Aig_ObjCreateCo(pAig_local,pAStack_30);
    for (local_34 = 0; iVar1 = Saig_ManRegNum(pAig), local_34 < iVar1; local_34 = local_34 + 1) {
      p = pAig->vCos;
      iVar1 = Saig_ManPoNum(pAig);
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p,local_34 + iVar1);
      pAVar3 = Aig_ObjChild0Copy(pAVar3);
      Aig_ObjCreateCo(pAig_local,pAVar3);
    }
    Aig_ManCleanup(pAig_local);
    iVar1 = Aig_ManRegNum(pAig);
    Aig_ManSetRegNum(pAig_local,iVar1);
  }
  else {
    printf("The AIG manager should have no constraints.\n");
    pAig_local = (Aig_Man_t *)0x0;
  }
  return pAig_local;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Duplicates while ORing the POs of sequential circuit.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Aig_Man_t * Saig_ManDupOrpos( Aig_Man_t * pAig )
{
    Aig_Man_t * pAigNew;
    Aig_Obj_t * pObj, * pMiter;
    int i;
    if ( pAig->nConstrs > 0 )
    {
        printf( "The AIG manager should have no constraints.\n" );
        return NULL;
    }
    // start the new manager
    pAigNew = Aig_ManStart( Aig_ManNodeNum(pAig) );
    pAigNew->pName = Abc_UtilStrsav( pAig->pName );
    pAigNew->nConstrs = pAig->nConstrs;
    // map the constant node
    Aig_ManConst1(pAig)->pData = Aig_ManConst1( pAigNew );
    // create variables for PIs
    Aig_ManForEachCi( pAig, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pAigNew );
    // add internal nodes of this frame
    Aig_ManForEachNode( pAig, pObj, i )
        pObj->pData = Aig_And( pAigNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // create PO of the circuit
    pMiter = Aig_ManConst0( pAigNew );
    Saig_ManForEachPo( pAig, pObj, i )
        pMiter = Aig_Or( pAigNew, pMiter, Aig_ObjChild0Copy(pObj) );
    Aig_ObjCreateCo( pAigNew, pMiter );
    // transfer to register outputs
    Saig_ManForEachLi( pAig, pObj, i )
        Aig_ObjCreateCo( pAigNew, Aig_ObjChild0Copy(pObj) );
    Aig_ManCleanup( pAigNew );
    Aig_ManSetRegNum( pAigNew, Aig_ManRegNum(pAig) );
    return pAigNew;
}